

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall Display::calculateStates(Display *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int __val;
  char cVar4;
  int x;
  long lVar5;
  int y;
  int y_00;
  long lVar6;
  string local_b8;
  Minefield mfield;
  
  Controller::getMinefield(&mfield,&this->controller);
  lVar5 = 0;
  do {
    iVar3 = Minefield::getXDimension(&mfield);
    if (iVar3 <= lVar5) {
      Minefield::~Minefield(&mfield);
      return;
    }
    for (lVar6 = 0; iVar3 = Minefield::getYDimension(&mfield), lVar6 < iVar3; lVar6 = lVar6 + 1) {
      iVar3 = (int)lVar5;
      y_00 = (int)lVar6;
      bVar2 = Minefield::isOpen(&mfield,iVar3,y_00);
      if (bVar2) {
        __val = Minefield::getSorroundingMineCount(&mfield,iVar3,y_00);
        std::__cxx11::to_string(&local_b8,__val);
        cVar4 = *local_b8._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&local_b8);
        bVar2 = Minefield::isMine(&mfield,iVar3,y_00);
        if (cVar4 == '0') {
          cVar4 = ' ';
        }
        if (bVar2) {
          __val = 0xb;
          cVar4 = 'X';
        }
      }
      else {
        bVar2 = Minefield::isGameLost(&mfield);
        if ((bVar2) && (bVar2 = Minefield::isMine(&mfield,iVar3,y_00), bVar2)) {
          bVar2 = Minefield::isFlagged(&mfield,iVar3,y_00);
          cVar4 = 'X';
          __val = 0xb;
          if (!bVar2) goto LAB_0010b391;
        }
        bVar2 = Minefield::isFlagged(&mfield,iVar3,y_00);
        cVar4 = '*';
        __val = 10;
        if (bVar2) {
          bVar2 = Minefield::isGameEnded(&mfield);
          cVar4 = '?';
          __val = 0;
          if (bVar2) {
            bVar2 = Minefield::isMine(&mfield,iVar3,y_00);
            __val = 0xb;
            if (bVar2) {
              __val = 0;
            }
          }
        }
      }
LAB_0010b391:
      lVar1 = *(long *)&(this->state).
                        super__Vector_base<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>,_std::allocator<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar5].
                        super__Vector_base<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>
                        ._M_impl.super__Vector_impl_data;
      if ((*(int *)(lVar1 + 4 + lVar6 * 8) != __val) || (*(char *)(lVar1 + lVar6 * 8) != cVar4)) {
        *(int *)(lVar1 + 4 + lVar6 * 8) = __val;
        *(char *)(lVar1 + lVar6 * 8) = cVar4;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void Display::calculateStates() {
    auto mfield = controller.getMinefield();
    
    for (int x = 0; x < mfield.getXDimension(); x++) {
        for (int y = 0; y < mfield.getYDimension(); y++) {
            char to_print;
            int color;
            if (mfield.isOpen(x, y)) {
                auto sourrounding_mine_count = mfield.getSorroundingMineCount(x, y);
                color = sourrounding_mine_count;
                to_print = std::to_string(sourrounding_mine_count).c_str()[0];
                if ('0' == to_print) {
                    to_print = ' ';
                }

                if (mfield.isMine(x, y)) {
                    color = 11;
                    to_print = 'X';
                }
            } else if (mfield.isGameLost() && mfield.isMine(x, y) && !mfield.isFlagged(x, y)) {
                // mark only unflagged mines
                color = 11;
                to_print = 'X';
            } else if (mfield.isFlagged(x, y)) {
                color = 0;
                to_print = '?';
                if (mfield.isGameEnded() && !mfield.isMine(x, y)) {
                    // incorrect mine -> make red
                    color = 11;
                }
            } else {
                color = 10;
                to_print = '*';
            }

            auto tuple_to_print = std::make_tuple(color, to_print);
            if (state[x][y] != tuple_to_print) {
                state[x][y] = tuple_to_print;
            }
        }
    }
}